

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O1

ktx_error_code_e
ktxTexture1_IterateLoadLevelFaces(ktxTexture1 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktx_error_code_e kVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  khronos_uint32_t *pkVar7;
  uint uVar8;
  ktx_uint32_t kVar9;
  uint uVar10;
  uint uVar11;
  ktx_uint32_t faceLodSize;
  khronos_uint32_t *local_80;
  ktx_uint32_t local_74;
  ktxTexture1 *local_70;
  uint local_64;
  ktxStream *local_60;
  ktxTexture_protected *local_58;
  ktxTexture1_private *local_50;
  ulong local_48;
  PFNKTXITERCB local_40;
  void *local_38;
  
  kVar1 = KTX_INVALID_VALUE;
  if (This != (ktxTexture1 *)0x0) {
    if (This->classId == ktxTexture1_c) {
      if (iterCb != (PFNKTXITERCB)0x0) {
        local_58 = This->_protected;
        kVar1 = KTX_INVALID_OPERATION;
        if ((local_58->_stream).data.file != (FILE *)0x0) {
          local_60 = &local_58->_stream;
          local_40 = iterCb;
          local_38 = userdata;
          if (This->numLevels == 0) {
            local_80 = (khronos_uint32_t *)0x0;
            kVar1 = KTX_SUCCESS;
          }
          else {
            local_50 = This->_private;
            uVar8 = 0;
            uVar5 = 0;
            local_80 = (khronos_uint32_t *)0x0;
            local_70 = This;
            do {
              bVar2 = (byte)uVar5;
              uVar4 = local_70->baseWidth >> (bVar2 & 0x1f);
              uVar11 = local_70->baseHeight >> (bVar2 & 0x1f);
              uVar10 = local_70->baseDepth >> (bVar2 & 0x1f);
              kVar1 = (*local_60->read)(local_60,&faceLodSize,4);
              iVar3 = 5;
              if (kVar1 == KTX_SUCCESS) {
                if (local_50->_needSwap == true) {
                  _ktxSwapEndian32(&faceLodSize,1);
                }
                iVar3 = 5;
                local_48 = (ulong)faceLodSize;
                if (local_80 == (khronos_uint32_t *)0x0) {
                  local_80 = (khronos_uint32_t *)malloc(local_48);
                  iVar3 = 5;
                  uVar6 = (uint)local_48;
                  if (local_80 != (khronos_uint32_t *)0x0) goto LAB_001e3b1a;
                  kVar1 = KTX_OUT_OF_MEMORY;
                  local_80 = (khronos_uint32_t *)0x0;
                }
                else {
                  kVar1 = KTX_FILE_DATA_ERROR;
                  uVar6 = uVar8;
                  if (faceLodSize <= uVar8) {
LAB_001e3b1a:
                    local_74 = 1;
                    if ((local_70->isCubemap == true) && (local_70->isArray == false)) {
                      local_74 = local_70->numFaces;
                    }
                    if (local_74 == 0) {
                      iVar3 = 0;
                      kVar1 = KTX_SUCCESS;
                      uVar8 = uVar6;
                    }
                    else {
                      kVar9 = 0;
                      pkVar7 = local_80;
                      local_64 = uVar6;
                      do {
                        kVar1 = (*local_60->read)(local_60,pkVar7,local_48);
                        pkVar7 = local_80;
                        if (kVar1 != KTX_SUCCESS) {
                          iVar3 = 5;
                          uVar8 = local_64;
                          goto LAB_001e3a9b;
                        }
                        if (local_50->_needSwap == true) {
                          if (local_58->_typeSize == 4) {
                            _ktxSwapEndian32(local_80,(ulong)(faceLodSize >> 2));
                          }
                          else if (local_58->_typeSize == 2) {
                            _ktxSwapEndian16((khronos_uint16_t *)local_80,(ulong)(faceLodSize >> 1))
                            ;
                          }
                        }
                        kVar1 = (*local_40)(uVar5,kVar9,uVar4 + (uVar4 == 0),uVar11 + (uVar11 == 0),
                                            uVar10 + (uVar10 == 0),(ktx_uint64_t)faceLodSize,pkVar7,
                                            local_38);
                        kVar9 = kVar9 + 1;
                      } while (local_74 != kVar9);
                      iVar3 = 0;
                      uVar8 = local_64;
                    }
                  }
                }
              }
LAB_001e3a9b:
              if (iVar3 != 0) {
                if (iVar3 != 5) {
                  return kVar1;
                }
                break;
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 < local_70->numLevels);
          }
          free(local_80);
          (*(local_58->_stream).destruct)(local_60);
        }
      }
    }
    else {
      kVar1 = KTX_INVALID_OPERATION;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture1_IterateLoadLevelFaces(ktxTexture1* This, PFNKTXITERCB iterCb,
                                  void* userdata)
{
    DECLARE_PRIVATE(ktxTexture1);
    struct ktxTexture_protected* prtctd = This->_protected;
    ktxStream* stream = (ktxStream *)&prtctd->_stream;
    ktx_uint32_t    dataSize = 0;
    ktx_uint32_t    miplevel;
    KTX_error_code  result = KTX_SUCCESS;
    void*           data = NULL;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->classId != ktxTexture1_c)
        return KTX_INVALID_OPERATION;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images are already loaded.
        return KTX_INVALID_OPERATION;

    for (miplevel = 0; miplevel < This->numLevels; ++miplevel)
    {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t faceLodSizePadded;
        ktx_uint32_t face;
        ktx_uint32_t innerIterations;
        GLsizei      width, height, depth;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> miplevel);
        height = MAX(1, This->baseHeight >> miplevel);
        depth = MAX(1, This->baseDepth  >> miplevel);

        result = stream->read(stream, &faceLodSize, sizeof(ktx_uint32_t));
        if (result != KTX_SUCCESS) {
            goto cleanup;
        }
        if (private->_needSwap) {
            _ktxSwapEndian32(&faceLodSize, 1);
        }
#if (KTX_GL_UNPACK_ALIGNMENT != 4)
        faceLodSizePadded = _KTX_PAD4(faceLodSize);
#else
        faceLodSizePadded = faceLodSize;
#endif
        if (!data) {
            /* allocate memory sufficient for the base miplevel */
            data = malloc(faceLodSizePadded);
            if (!data) {
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
            }
            dataSize = faceLodSizePadded;
        }
        else if (dataSize < faceLodSizePadded) {
            /* subsequent miplevels cannot be larger than the base miplevel */
            result = KTX_FILE_DATA_ERROR;
            goto cleanup;
        }

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        if (This->isCubemap && !This->isArray)
            innerIterations = This->numFaces;
        else
            innerIterations = 1;
        for (face = 0; face < innerIterations; ++face)
        {
            /* And all z_slices are also passed as a group hence no
             *    for (z_slice = 0; z_slice < This->depth)
             */
            result = stream->read(stream, data, faceLodSizePadded);
            if (result != KTX_SUCCESS) {
                goto cleanup;
            }

            /* Perform endianness conversion on texture data */
            if (private->_needSwap) {
                if (prtctd->_typeSize == 2)
                    _ktxSwapEndian16((ktx_uint16_t*)data, faceLodSize / 2);
                else if (prtctd->_typeSize == 4)
                    _ktxSwapEndian32((ktx_uint32_t*)data, faceLodSize / 4);
            }

            result = iterCb(miplevel, face,
                             width, height, depth,
                             faceLodSize, data, userdata);
        }
    }

cleanup:
    free(data);
    // No further need for this.
    stream->destruct(stream);

    return result;
}